

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_4>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_4>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_4>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  Expr<tcu::Vector<float,_4>_> *this_01;
  Expr<int> *this_02;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar1;
  IArg3 local_93 [2];
  IArg2 local_91;
  IVal local_90;
  IVal local_78;
  EvalContext *local_18;
  EvalContext *ctx_local;
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_4>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  this_00 = this->m_func;
  local_18 = ctx;
  ctx_local = (EvalContext *)this;
  this_01 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::
            operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>
                        *)&this->m_args);
  Expr<tcu::Vector<float,_4>_>::evaluate(&local_78,this_01,local_18);
  this_02 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>::operator->
                      ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_> *)
                       &(this->m_args).b);
  Expr<int>::evaluate(&local_90,this_02,local_18);
  pEVar1 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                         *)&(this->m_args).c);
  Expr<deqp::gls::BuiltinPrecisionTests::Void>::evaluate(pEVar1,local_18);
  pEVar1 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                         *)&(this->m_args).d);
  Expr<deqp::gls::BuiltinPrecisionTests::Void>::evaluate(pEVar1,local_18);
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_4>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::apply(__return_storage_ptr__,this_00,ctx,&local_78,&local_90,&local_91,local_93);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}